

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O1

int Lf_ObjArrival_rec(Lf_Man_t *p,Gia_Obj_t *pDriver)

{
  Gia_Obj_t *pGVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  
  while( true ) {
    uVar2 = (uint)((ulong)*(undefined8 *)pDriver >> 0x20);
    uVar5 = uVar2 & 0x1fffffff;
    uVar4 = (uint)*(undefined8 *)pDriver;
    if ((((int)uVar4 < 0) || ((uVar4 & 0x1fffffff) == 0x1fffffff)) ||
       ((uVar4 & 0x1fffffff) != uVar5)) break;
    pDriver = pDriver + -(ulong)(uVar4 & 0x1fffffff);
  }
  if ((uVar4 & 0x1fffffff) == 0x1fffffff || (int)uVar4 < 0) {
    iVar3 = 0;
    if ((~uVar4 & 0x9fffffff) == 0) {
      if (-1 < (int)uVar4) {
        __assert_fail("pObj->fTerm",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1ac,"int Gia_ObjCioId(Gia_Obj_t *)");
      }
      if ((p->vCiArrivals).nSize <= (int)uVar5) goto LAB_006d038e;
      iVar3 = (p->vCiArrivals).pArray[uVar2 & 0x1fffffff];
    }
  }
  else {
    pGVar1 = p->pGia->pObjs;
    if ((pDriver < pGVar1) || (pGVar1 + p->pGia->nObjs <= pDriver)) {
      __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                    ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
    }
    uVar2 = (int)((long)pDriver - (long)pGVar1 >> 2) * -0x55555555;
    if (((int)uVar2 < 0) || ((p->vOffsets).nSize <= (int)uVar2)) {
LAB_006d038e:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    iVar3 = p->pObjBests[(p->vOffsets).pArray[uVar2 & 0x7fffffff]].Delay[0];
  }
  return iVar3;
}

Assistant:

int Lf_ObjArrival_rec( Lf_Man_t * p, Gia_Obj_t * pDriver )
{
    if ( Gia_ObjIsBuf(pDriver) )
        return Lf_ObjArrival_rec( p, Gia_ObjFanin0(pDriver) );
    if ( Gia_ObjIsAnd(pDriver) )
        return Lf_ObjReadBest(p, Gia_ObjId(p->pGia, pDriver))->Delay[0];
    if ( Gia_ObjIsCi(pDriver) )
        return Lf_ObjCiArrival(p, Gia_ObjCioId(pDriver));
    return 0;
}